

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

base_block_t *
base_block_alloc(tsdn_t *tsdn,base_t *base,extent_hooks_t *extent_hooks,uint ind,pszind_t *pind_last
                ,size_t *extent_sn_next,size_t size,size_t alignment)

{
  uint uVar1;
  size_t sVar2;
  long lVar3;
  base_t *pbVar4;
  uint uVar5;
  pszind_t pVar6;
  base_block_t *addr_00;
  tsd_t *tsd;
  byte bVar7;
  ulong uVar8;
  base_block_t *pbVar9;
  void *addr;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  base_block_t *addr_01;
  long lVar13;
  base_t *pbVar14;
  char *in_FS_OFFSET;
  bool bVar15;
  _Bool local_52;
  _Bool zero;
  base_t *local_50;
  size_t *local_48;
  pszind_t *local_40;
  tsdn_t *local_38;
  arena_t *arena;
  
  uVar8 = alignment + 0xf & 0xfffffffffffffff0;
  uVar8 = (uVar8 + 0x8f & -uVar8) + ((size + uVar8) - 1 & -uVar8);
  lVar13 = -1;
  if (uVar8 < 0x7000000000000001) {
    uVar12 = uVar8 * 2 - 1;
    lVar3 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    uVar12 = 0xfff;
    if (0xe < (uint)lVar3) {
      uVar12 = ~(-1L << ((char)lVar3 - 3U & 0x3f));
    }
    uVar8 = (~uVar12 & uVar8 + uVar12) + 0x1fffff;
  }
  else {
    uVar8 = 0x7000000000200fff;
  }
  for (lVar3 = 0x3f; 0xdfffffffffffffffU >> lVar3 == 0; lVar3 = lVar3 + -1) {
  }
  uVar5 = (uint)lVar3;
  iVar11 = uVar5 - 0xe;
  if (uVar5 < 0xe) {
    iVar11 = 0;
  }
  uVar1 = *pind_last + 1;
  bVar7 = (char)lVar3 - 3;
  if (uVar5 < 0xf) {
    bVar7 = 0xc;
  }
  uVar10 = (uint)(((0x6fffffffffffffffU >> (bVar7 & 0x3f)) << (bVar7 & 0x3f)) >> (bVar7 & 0x3f)) & 3
  ;
  arena = (arena_t *)(ulong)uVar10;
  uVar5 = *pind_last;
  if (uVar1 < uVar10 + iVar11 * 4) {
    uVar5 = uVar1;
  }
  uVar12 = sz_pind2sz_tab[uVar5] + 0x1fffff;
  if (sz_pind2sz_tab[uVar5] + 0x1fffff < uVar8) {
    uVar12 = uVar8;
  }
  uVar12 = uVar12 & 0xffffffffffe00000;
  zero = true;
  local_52 = true;
  local_50 = base;
  local_38 = tsdn;
  if (extent_hooks == &extent_hooks_default) {
    addr_00 = (base_block_t *)extent_alloc_mmap((void *)0x0,uVar12,0x200000,&zero,&local_52);
  }
  else {
    tsd = &tsdn->tsd;
    local_48 = extent_sn_next;
    local_40 = pind_last;
    if ((tsdn == (tsdn_t *)0x0) && (tsd = *(tsd_t **)in_FS_OFFSET, *in_FS_OFFSET != '\0')) {
      arena = (arena_t *)0x0;
      tsd = tsd_fetch_slow(tsd,false);
    }
    pre_reentrancy(tsd,arena);
    addr_00 = (base_block_t *)
              (*extent_hooks->alloc)(extent_hooks,(void *)0x0,uVar12,0x200000,&zero,&local_52,ind);
    post_reentrancy(tsd);
    pind_last = local_40;
    extent_sn_next = local_48;
  }
  pbVar14 = local_50;
  if (addr_00 != (base_block_t *)0x0) {
    if ((opt_metadata_thp != metadata_thp_disabled) && (init_system_thp_mode == thp_mode_default)) {
      if (opt_metadata_thp == metadata_thp_always) {
        pages_huge(addr_00,uVar12);
      }
      else if (local_50 != (base_t *)0x0 && opt_metadata_thp == metadata_thp_auto) {
        local_48 = extent_sn_next;
        local_40 = pind_last;
        malloc_mutex_lock(local_38,&local_50->mtx);
        pbVar4 = local_50;
        bVar7 = pbVar14->auto_thp_switched;
        if ((_Bool)bVar7 == false) {
          addr_01 = pbVar14->blocks;
          pbVar9 = addr_01;
          do {
            pbVar9 = pbVar9->next;
            lVar13 = lVar13 + 1;
          } while (pbVar9 != (base_block_t *)0x0);
          if (pbVar14->ind == 0) {
            bVar15 = lVar13 == 3;
          }
          else {
            bVar15 = lVar13 == 0;
          }
          pbVar14 = pbVar4;
          if (bVar15) {
            local_50->auto_thp_switched = true;
            for (; addr_01 != (base_block_t *)0x0; addr_01 = addr_01->next) {
              pages_huge(addr_01,addr_01->size);
              pbVar4->n_thp =
                   pbVar4->n_thp +
                   ((addr_01->size - (addr_01->extent).field_2.e_size_esn) + 0x1fffff >> 0x15);
            }
            bVar7 = pbVar4->auto_thp_switched;
          }
        }
        if ((bVar7 & 1) != 0) {
          pages_huge(addr_00,uVar12);
        }
        (pbVar14->mtx).field_0.field_0.locked.repr = false;
        pthread_mutex_unlock((pthread_mutex_t *)((long)&(pbVar14->mtx).field_0 + 0x40));
        pind_last = local_40;
        extent_sn_next = local_48;
      }
    }
    if (uVar12 < 0x7000000000000001) {
      uVar8 = uVar12 * 2 - 1;
      lVar13 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar13 == 0; lVar13 = lVar13 + -1) {
        }
      }
      uVar5 = (uint)lVar13;
      iVar11 = uVar5 - 0xe;
      if (uVar5 < 0xe) {
        iVar11 = 0;
      }
      bVar7 = (char)lVar13 - 3;
      if (uVar5 < 0xf) {
        bVar7 = 0xc;
      }
      pVar6 = ((uint)(((uVar12 - 1 >> (bVar7 & 0x3f)) << (bVar7 & 0x3f)) >> (bVar7 & 0x3f)) & 3) +
              iVar11 * 4;
    }
    else {
      pVar6 = 199;
    }
    *pind_last = pVar6;
    addr_00->size = uVar12;
    addr_00->next = (base_block_t *)0x0;
    sVar2 = *extent_sn_next;
    *extent_sn_next = sVar2 + 1;
    (addr_00->extent).e_addr = addr_00 + 1;
    (addr_00->extent).field_2.e_size_esn = uVar12 - 0x90;
    (addr_00->extent).e_bits =
         ((addr_00->extent).e_bits & 0x3fffc000000) + (sVar2 << 0x2a) + 0x3a0efff;
  }
  return addr_00;
}

Assistant:

static base_block_t *
base_block_alloc(tsdn_t *tsdn, base_t *base, extent_hooks_t *extent_hooks,
    unsigned ind, pszind_t *pind_last, size_t *extent_sn_next, size_t size,
    size_t alignment) {
	alignment = ALIGNMENT_CEILING(alignment, QUANTUM);
	size_t usize = ALIGNMENT_CEILING(size, alignment);
	size_t header_size = sizeof(base_block_t);
	size_t gap_size = ALIGNMENT_CEILING(header_size, alignment) -
	    header_size;
	/*
	 * Create increasingly larger blocks in order to limit the total number
	 * of disjoint virtual memory ranges.  Choose the next size in the page
	 * size class series (skipping size classes that are not a multiple of
	 * HUGEPAGE), or a size large enough to satisfy the requested size and
	 * alignment, whichever is larger.
	 */
	size_t min_block_size = HUGEPAGE_CEILING(sz_psz2u(header_size + gap_size
	    + usize));
	pszind_t pind_next = (*pind_last + 1 < sz_psz2ind(SC_LARGE_MAXCLASS)) ?
	    *pind_last + 1 : *pind_last;
	size_t next_block_size = HUGEPAGE_CEILING(sz_pind2sz(pind_next));
	size_t block_size = (min_block_size > next_block_size) ? min_block_size
	    : next_block_size;
	base_block_t *block = (base_block_t *)base_map(tsdn, extent_hooks, ind,
	    block_size);
	if (block == NULL) {
		return NULL;
	}

	if (metadata_thp_madvise()) {
		void *addr = (void *)block;
		assert(((uintptr_t)addr & HUGEPAGE_MASK) == 0 &&
		    (block_size & HUGEPAGE_MASK) == 0);
		if (opt_metadata_thp == metadata_thp_always) {
			pages_huge(addr, block_size);
		} else if (opt_metadata_thp == metadata_thp_auto &&
		    base != NULL) {
			/* base != NULL indicates this is not a new base. */
			malloc_mutex_lock(tsdn, &base->mtx);
			base_auto_thp_switch(tsdn, base);
			if (base->auto_thp_switched) {
				pages_huge(addr, block_size);
			}
			malloc_mutex_unlock(tsdn, &base->mtx);
		}
	}

	*pind_last = sz_psz2ind(block_size);
	block->size = block_size;
	block->next = NULL;
	assert(block_size >= header_size);
	base_extent_init(extent_sn_next, &block->extent,
	    (void *)((uintptr_t)block + header_size), block_size - header_size);
	return block;
}